

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePrinter.cpp
# Opt level: O0

void __thiscall
slang::ast::TypePrinter::visit(TypePrinter *this,AssociativeArrayType *type,string_view param_3)

{
  string_view str;
  string_view str_00;
  string_view str_01;
  pointer pFVar1;
  pointer __str;
  long in_RSI;
  long in_RDI;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_000005b0;
  TypePrinter *in_stack_000005b8;
  Symbol *in_stack_000005c0;
  size_t in_stack_ffffffffffffff58;
  char *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  pointer in_stack_ffffffffffffff70;
  size_t in_stack_ffffffffffffff78;
  undefined8 local_70;
  TypePrinter *in_stack_ffffffffffffffa0;
  
  if (*(int *)(in_RDI + 8) == 1) {
    pFVar1 = std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::
             operator->((unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
                         *)0xa6e9cc);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff70,
               in_stack_ffffffffffffff68);
    str._M_str = (char *)pFVar1;
    str._M_len = in_stack_ffffffffffffff78;
    FormatBuffer::append(in_stack_ffffffffffffff70,str);
    if (*(long *)(in_RSI + 0x50) == 0) {
      in_stack_ffffffffffffff70 =
           std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::
           operator->((unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_> *)
                      0xa6ea57);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff70,
                 in_stack_ffffffffffffff68);
      str_00._M_str = (char *)pFVar1;
      str_00._M_len = in_stack_ffffffffffffff78;
      FormatBuffer::append(in_stack_ffffffffffffff70,str_00);
    }
    else {
      in_stack_ffffffffffffff78 = *(size_t *)(in_RSI + 0x50);
      sv(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      Symbol::visit<slang::ast::TypePrinter&,std::basic_string_view<char,std::char_traits<char>>>
                (in_stack_000005c0,in_stack_000005b8,in_stack_000005b0);
    }
    __str = std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::
            operator->((unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_> *
                       )0xa6ea8f);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff70,
               in_stack_ffffffffffffff68);
    str_01._M_str = (char *)pFVar1;
    str_01._M_len = in_stack_ffffffffffffff78;
    FormatBuffer::append(in_stack_ffffffffffffff70,str_01);
    sv((char *)__str,in_stack_ffffffffffffff58);
    Symbol::visit<slang::ast::TypePrinter&,std::basic_string_view<char,std::char_traits<char>>>
              (in_stack_000005c0,in_stack_000005b8,in_stack_000005b0);
  }
  else {
    printUnpackedArray(in_stack_ffffffffffffffa0,local_70);
  }
  return;
}

Assistant:

void TypePrinter::visit(const AssociativeArrayType& type, std::string_view) {
    if (options.anonymousTypeStyle == TypePrintingOptions::FriendlyName) {
        buffer->append("associative array [");
        if (type.indexType)
            type.indexType->visit(*this, ""sv);
        else
            buffer->append("*");

        buffer->append("] of ");
        type.elementType.visit(*this, ""sv);
    }
    else {
        printUnpackedArray(type);
    }
}